

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O2

void __thiscall StreamReplacer::StreamReplacer(StreamReplacer *this,QPDF *pdf)

{
  _Rb_tree_header *p_Var1;
  
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,false);
  *(undefined ***)this = &PTR__StreamReplacer_0010ab38;
  this->pdf = pdf;
  p_Var1 = &(this->copied_streams)._M_t._M_impl.super__Rb_tree_header;
  (this->copied_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->copied_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->copied_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->copied_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->copied_streams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->keys)._M_t._M_impl.super__Rb_tree_header;
  (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

StreamReplacer::StreamReplacer(QPDF* pdf) :
    pdf(pdf)
{
}